

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

void avx::Threshold(uint32_t rowSizeIn,uint32_t rowSizeOut,uint8_t *inY,uint8_t *outY,
                   uint8_t *outYEnd,uint8_t threshold,uint32_t simdWidth,uint32_t totalSimdWidth,
                   uint32_t nonSimdWidth)

{
  undefined1 auVar1 [32];
  uint8_t *puVar2;
  undefined3 in_register_00000089;
  uint8_t *puVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  
  if (CONCAT31(in_register_00000089,threshold) == 0) {
    for (; outY != outYEnd; outY = outY + rowSizeOut) {
      memset(outY,0xff,(ulong)(nonSimdWidth + totalSimdWidth));
    }
  }
  else {
    auVar7[8] = 0x80;
    auVar7._0_8_ = 0x8080808080808080;
    auVar7[9] = 0x80;
    auVar7[10] = 0x80;
    auVar7[0xb] = 0x80;
    auVar7[0xc] = 0x80;
    auVar7[0xd] = 0x80;
    auVar7[0xe] = 0x80;
    auVar7[0xf] = 0x80;
    auVar7[0x10] = 0x80;
    auVar7[0x11] = 0x80;
    auVar7[0x12] = 0x80;
    auVar7[0x13] = 0x80;
    auVar7[0x14] = 0x80;
    auVar7[0x15] = 0x80;
    auVar7[0x16] = 0x80;
    auVar7[0x17] = 0x80;
    auVar7[0x18] = 0x80;
    auVar7[0x19] = 0x80;
    auVar7[0x1a] = 0x80;
    auVar7[0x1b] = 0x80;
    auVar7[0x1c] = 0x80;
    auVar7[0x1d] = 0x80;
    auVar7[0x1e] = 0x80;
    auVar7[0x1f] = 0x80;
    puVar3 = inY + totalSimdWidth;
    puVar2 = outY + totalSimdWidth;
    auVar6 = vpbroadcastb_avx512vl();
    for (; outY != outYEnd; outY = outY + rowSizeOut) {
      for (lVar4 = 0; (ulong)simdWidth << 5 != lVar4; lVar4 = lVar4 + 0x20) {
        auVar1 = vpcmpgtb_avx2(auVar7 ^ *(undefined1 (*) [32])(inY + lVar4),auVar6);
        *(undefined1 (*) [32])(outY + lVar4) = auVar1;
      }
      if (nonSimdWidth != 0) {
        for (uVar5 = 0; nonSimdWidth != uVar5; uVar5 = uVar5 + 1) {
          puVar2[uVar5] = (puVar3[uVar5] < threshold) + 0xff;
        }
      }
      inY = inY + rowSizeIn;
      puVar3 = puVar3 + rowSizeIn;
      puVar2 = puVar2 + rowSizeOut;
    }
  }
  return;
}

Assistant:

void Threshold( uint32_t rowSizeIn, uint32_t rowSizeOut, const uint8_t * inY, uint8_t * outY, const uint8_t * outYEnd, uint8_t threshold,
                    uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        // AVX does not have command "great or equal to" so we have 2 situations:
        // when threshold value is 0 and it is not
        if( threshold > 0 ) {
            const char maskValue = static_cast<char>(0x80u);
            const simd mask = _mm256_set_epi8(
                maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue,
                maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue,
                maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue,
                maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue, maskValue );

            const char compareValue = static_cast<char>((threshold - 1) ^ 0x80u);
            const simd compare = _mm256_set_epi8(
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue,
                compareValue, compareValue, compareValue, compareValue );

            for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
                const simd * src1 = reinterpret_cast <const simd*> (inY);
                simd       * dst  = reinterpret_cast <simd*> (outY);

                const simd * src1End = src1 + simdWidth;

                for( ; src1 != src1End; ++src1, ++dst )
                    _mm256_storeu_si256( dst, _mm256_cmpgt_epi8( _mm256_xor_si256( _mm256_loadu_si256( src1 ), mask ), compare ) );

                if( nonSimdWidth > 0 ) {
                    const uint8_t * inX  = inY  + totalSimdWidth;
                    uint8_t       * outX = outY + totalSimdWidth;

                    const uint8_t * outXEnd = outX + nonSimdWidth;

                    for( ; outX != outXEnd; ++outX, ++inX )
                        (*outX) = (*inX) < threshold ? 0 : 255;
                }
            }
        }
        else {
            for( ; outY != outYEnd; outY += rowSizeOut )
                memset( outY, 255u, sizeof( uint8_t ) * (totalSimdWidth + nonSimdWidth) );
        }
    }